

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread-priority.c
# Opt level: O1

int run_test_thread_priority(void)

{
  int iVar1;
  int iVar2;
  pthread_t pVar3;
  int64_t eval_b;
  int64_t eval_b_2;
  int priority;
  uv_thread_t task_id;
  int policy;
  sched_param param;
  int local_1c;
  pthread_t local_18;
  int local_10;
  sched_param local_c;
  
  local_18 = 0xffffffffffffffea;
  iVar1 = uv_thread_getpriority(0,0);
  if (local_18 == (long)iVar1) {
    iVar1 = uv_sem_init(&sem,1);
    local_18 = (pthread_t)iVar1;
    if (local_18 != 0) goto LAB_001d330b;
    uv_sem_wait(&sem);
    iVar1 = uv_thread_create(&local_18,simple_task,0);
    if (iVar1 != 0) goto LAB_001d331a;
    iVar1 = uv_thread_getpriority(local_18,&local_1c);
    if (iVar1 != 0) goto LAB_001d3329;
    iVar1 = pthread_getschedparam(local_18,&local_10,&local_c);
    if (iVar1 != 0) goto LAB_001d3338;
    iVar1 = sched_get_priority_min(local_10);
    iVar2 = sched_get_priority_max(local_10);
    if ((local_1c < iVar1) || (iVar2 < local_1c)) goto LAB_001d3347;
    iVar2 = uv_thread_setpriority(local_18,0xfffffffe);
    if (iVar2 != 0) goto LAB_001d334c;
    iVar2 = uv_thread_getpriority(local_18,&local_1c);
    if (iVar2 != 0) goto LAB_001d335b;
    if (local_1c != iVar1) goto LAB_001d336a;
    pVar3 = pthread_self();
    iVar1 = uv_thread_getpriority(pVar3,&local_1c);
    if (iVar1 != 0) goto LAB_001d3379;
    if (local_1c != 0) goto LAB_001d3388;
    iVar1 = uv_thread_setpriority(pVar3,0xfffffffe);
    if (iVar1 != 0) goto LAB_001d3397;
    iVar1 = uv_thread_getpriority(pVar3,&local_1c);
    if (iVar1 != 0) goto LAB_001d33a6;
    if (local_1c == 4) {
      uv_sem_post(&sem);
      iVar1 = uv_thread_join(&local_18);
      if (iVar1 == 0) {
        uv_sem_destroy(&sem);
        return 0;
      }
      goto LAB_001d33c4;
    }
  }
  else {
    run_test_thread_priority_cold_1();
LAB_001d330b:
    run_test_thread_priority_cold_2();
LAB_001d331a:
    run_test_thread_priority_cold_3();
LAB_001d3329:
    run_test_thread_priority_cold_4();
LAB_001d3338:
    run_test_thread_priority_cold_5();
LAB_001d3347:
    run_test_thread_priority_cold_15();
LAB_001d334c:
    run_test_thread_priority_cold_6();
LAB_001d335b:
    run_test_thread_priority_cold_7();
LAB_001d336a:
    run_test_thread_priority_cold_8();
LAB_001d3379:
    run_test_thread_priority_cold_9();
LAB_001d3388:
    run_test_thread_priority_cold_10();
LAB_001d3397:
    run_test_thread_priority_cold_11();
LAB_001d33a6:
    run_test_thread_priority_cold_12();
  }
  run_test_thread_priority_cold_13();
LAB_001d33c4:
  run_test_thread_priority_cold_14();
  uv_sem_wait(&sem);
  iVar1 = puts("in simple_task");
  return iVar1;
}

Assistant:

TEST_IMPL(thread_priority) {
  int priority;
#ifndef _WIN32
  int min;
  int max;
  int policy;
  struct sched_param param;
#endif
  uv_thread_t task_id;

  /* Verify that passing a NULL pointer returns UV_EINVAL. */
  ASSERT_EQ(UV_EINVAL, uv_thread_getpriority(0, NULL));
  ASSERT_OK(uv_sem_init(&sem, 1));
  uv_sem_wait(&sem);
  ASSERT_OK(uv_thread_create(&task_id, simple_task, NULL));
  ASSERT_OK(uv_thread_getpriority(task_id, &priority));

#ifdef _WIN32
  ASSERT_EQ(priority, THREAD_PRIORITY_NORMAL);
#else
  ASSERT_OK(pthread_getschedparam(task_id, &policy, &param));
#ifdef __PASE__
  min = 1;
  max = 127;
#else
  min = sched_get_priority_min(policy);
  max = sched_get_priority_max(policy);
#endif
  ASSERT(priority >= min && priority <= max);
#endif

  ASSERT_OK(uv_thread_setpriority(task_id, UV_THREAD_PRIORITY_LOWEST));
  ASSERT_OK(uv_thread_getpriority(task_id, &priority));

#ifdef _WIN32
  ASSERT_EQ(priority, THREAD_PRIORITY_LOWEST);
#else
  ASSERT_EQ(priority, min);
#endif

/**
 * test set nice value for the calling thread with default schedule policy
*/
#ifdef __linux__
  ASSERT_OK(uv_thread_getpriority(pthread_self(), &priority));
  ASSERT_EQ(priority, 0);
  ASSERT_OK(uv_thread_setpriority(pthread_self(), UV_THREAD_PRIORITY_LOWEST));
  ASSERT_OK(uv_thread_getpriority(pthread_self(), &priority));
  ASSERT_EQ(priority, (0 - UV_THREAD_PRIORITY_LOWEST * 2));
#endif

  uv_sem_post(&sem);

  ASSERT_OK(uv_thread_join(&task_id));

  uv_sem_destroy(&sem);

  return 0;
}